

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

cfg_named_section * cfg_db_find_namedsection(cfg_db *db,char *section_type,char *section_name)

{
  cfg_named_section *local_80;
  avl_node *local_78;
  cfg_named_section *local_70;
  cfg_named_section *named;
  cfg_section_type *section;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  
  local_70 = (cfg_named_section *)0x0;
  local_78 = avl_find(&db->sectiontypes,section_type);
  if (local_78 == (avl_node *)0x0) {
    local_78 = (avl_node *)0x0;
  }
  if (local_78 != (avl_node *)0x0) {
    local_80 = (cfg_named_section *)avl_find((avl_tree *)&local_78[1].parent,section_name);
    if (local_80 == (cfg_named_section *)0x0) {
      local_80 = (cfg_named_section *)0x0;
    }
    local_70 = local_80;
  }
  return local_70;
}

Assistant:

struct cfg_named_section *
cfg_db_find_namedsection(const struct cfg_db *db, const char *section_type, const char *section_name) {
  struct cfg_section_type *section;
  struct cfg_named_section *named = NULL;

  section = cfg_db_find_sectiontype(db, section_type);
  if (section != NULL) {
    named = avl_find_element(&section->names, section_name, named, node);
  }
  return named;
}